

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64
drwav_read_pcm_frames_s32be(drwav *pWav,drwav_uint64 framesToRead,drwav_int32 *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  drwav_uint64 dVar3;
  long lVar4;
  
  dVar3 = drwav_read_pcm_frames_s32(pWav,framesToRead,pBufferOut);
  if (pBufferOut != (drwav_int32 *)0x0) {
    uVar1 = pWav->channels;
    for (lVar4 = 0; dVar3 * uVar1 - lVar4 != 0; lVar4 = lVar4 + 1) {
      uVar2 = pBufferOut[lVar4];
      pBufferOut[lVar4] =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
  }
  return dVar3;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s32be(drwav* pWav, drwav_uint64 framesToRead, drwav_int32* pBufferOut)
{
    drwav_uint64 framesRead = drwav_read_pcm_frames_s32(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && drwav__is_little_endian() == DRWAV_TRUE) {
        drwav__bswap_samples_s32(pBufferOut, framesRead*pWav->channels);
    }

    return framesRead;
}